

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_format(lua_State *L)

{
  byte *__src;
  double dVar1;
  uint uVar2;
  MSize MVar3;
  uint uVar4;
  TValue *pTVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  cTValue *pcVar8;
  TValue *pTVar9;
  char cVar10;
  uint uVar11;
  GCstr *pGVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  byte *pbVar16;
  size_t l;
  char *pcVar17;
  size_t sVar18;
  char *pcVar19;
  cTValue *pcVar20;
  GCstr *pGVar21;
  byte bVar22;
  ulong uVar23;
  byte *pbVar24;
  cTValue *o;
  GCstr *pGVar25;
  ulong uVar26;
  uint uVar27;
  size_t sStack_22c0;
  char form [18];
  int local_2278;
  TValue tv;
  char nbuf [32];
  char buff [512];
  luaL_Buffer b;
  
  pTVar5 = L->top;
  pTVar6 = L->base;
  pGVar12 = lj_lib_checkstr(L,1);
  pGVar25 = pGVar12 + 1;
  uVar2 = pGVar12->len;
  b.lvl = 0;
  b.p = b.buffer;
  b.L = L;
  uVar27 = 1;
LAB_0013d31b:
  while( true ) {
    while( true ) {
      if ((GCstr *)((long)&pGVar12[1].nextgc.gcptr32 + (ulong)uVar2) <= pGVar25) {
        luaL_pushresult(&b);
        return 1;
      }
      bVar22 = (byte)(pGVar25->nextgc).gcptr32;
      if (bVar22 == 0x25) break;
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
        bVar22 = (byte)(pGVar25->nextgc).gcptr32;
      }
      pGVar25 = (GCstr *)((long)&(pGVar25->nextgc).gcptr32 + 1);
      *b.p = bVar22;
      b.p = (char *)((byte *)b.p + 1);
    }
    __src = (byte *)((long)&(pGVar25->nextgc).gcptr32 + 1);
    bVar22 = *(byte *)((long)&(pGVar25->nextgc).gcptr32 + 1);
    if (bVar22 != 0x25) break;
    bVar22 = 0x25;
    if (&stack0xffffffffffffffd0 <= b.p) {
      luaL_prepbuffer(&b);
      bVar22 = *__src;
    }
    pGVar25 = (GCstr *)((long)&(pGVar25->nextgc).gcptr32 + 2);
    *b.p = bVar22;
    b.p = (char *)((byte *)b.p + 1);
  }
  uVar11 = uVar27 + 1;
  local_2278 = (int)((ulong)((long)pTVar5 - (long)pTVar6) >> 3);
  if (local_2278 <= (int)uVar27) {
    err_argmsg(L,uVar11,"no value");
  }
  uVar23 = 0;
  while ((bVar22 != 0 && (pvVar13 = memchr("-+ #0",(int)(char)bVar22,6), pvVar13 != (void *)0x0))) {
    bVar22 = *(byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + 2);
    uVar23 = uVar23 + 1;
  }
  if (5 < uVar23) {
    lj_err_caller(L,LJ_ERR_STRFMTR);
  }
  uVar14 = (ulong)(""[(ulong)bVar22 + 1] >> 3 & 1);
  uVar26 = (ulong)(""[(ulong)*(byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + 1 + uVar14) + 1]
                   >> 3 & 1);
  lVar15 = uVar26 + uVar14;
  bVar22 = *(byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + 1 + lVar15);
  if (bVar22 == 0x2e) {
    lVar15 = uVar14 + uVar26;
    pbVar16 = (byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + lVar15 + 2);
    pbVar24 = (byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + 3 + lVar15);
    if ((""[(ulong)*pbVar16 + 1] & 8) == 0) {
      pbVar24 = pbVar16;
    }
    pbVar24 = pbVar24 + ((""[(ulong)*pbVar24 + 1] >> 3 & 1) != 0);
    bVar22 = *pbVar24;
  }
  else {
    pbVar24 = (byte *)((long)&(pGVar25->nextgc).gcptr32 + uVar23 + lVar15 + 1);
  }
  if ((""[(ulong)bVar22 + 1] & 8) != 0) {
    lj_err_caller(L,LJ_ERR_STRFMTW);
  }
  form[0] = '%';
  strncpy(form + 1,(char *)__src,(size_t)(pbVar24 + (1 - (long)__src)));
  pbVar24[(long)(form + (2 - (long)__src))] = 0;
  pGVar25 = (GCstr *)(pbVar24 + 1);
  bVar22 = *pbVar24;
  uVar27 = uVar11;
  if (0x20 < bVar22 - 0x58) {
    if (((bVar22 != 0x41) && (bVar22 != 0x45)) && (bVar22 != 0x47)) goto switchD_0013d4b8_caseD_59;
switchD_0013d4b8_caseD_61:
    tv.n = lj_lib_checknum(L,uVar11);
    if ((ulong)ABS(tv.n) < 0x7ff0000000000000) {
      sprintf(buff,form);
    }
    else {
      sVar18 = lj_str_bufnum(nbuf,&tv);
      if ((char)*pbVar24 < 'a') {
        pcVar17 = nbuf + (sVar18 - 3);
        *pcVar17 = *pcVar17 + -0x20;
        pcVar17 = nbuf + (sVar18 - 2);
        *pcVar17 = *pcVar17 + -0x20;
        pcVar17 = nbuf + (sVar18 - 1);
        *pcVar17 = *pcVar17 + -0x20;
      }
      nbuf[sVar18] = '\0';
      pcVar17 = form;
      do {
        pcVar19 = pcVar17;
        if ('@' < *pcVar19) break;
        pcVar17 = pcVar19 + 1;
      } while (*pcVar19 != '.');
      pcVar19[0] = 's';
      pcVar19[1] = '\0';
      sprintf(buff,form,nbuf);
    }
    goto LAB_0013d5b4;
  }
  uVar23 = (ulong)uVar11;
  switch((uint)bVar22) {
  case 0x58:
  case 0x6f:
  case 0x75:
  case 0x78:
    addintlen(form);
    lj_lib_checknum(L,uVar11);
    dVar1 = L->base[uVar23 - 1].n;
    pGVar21 = (GCstr *)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
    if (*(int *)((long)L->base + uVar23 * 8 + -4) < 0) {
      pGVar21 = (GCstr *)(long)dVar1;
    }
    break;
  default:
switchD_0013d4b8_caseD_59:
    lj_err_callerv(L,LJ_ERR_STRFMTO,(ulong)(uint)(int)(char)bVar22);
  case 0x61:
  case 0x65:
  case 0x66:
  case 0x67:
    goto switchD_0013d4b8_caseD_61;
  case 99:
    uVar11 = lj_lib_checkint(L,uVar11);
    sprintf(buff,form,(ulong)uVar11);
    goto LAB_0013d5b4;
  case 100:
  case 0x69:
    addintlen(form);
    lj_lib_checknum(L,uVar11);
    pGVar21 = (GCstr *)(long)L->base[uVar23 - 1].n;
    break;
  case 0x70:
    pvVar13 = lua_topointer(L,uVar11);
    lj_str_pushf(L,"%p",pvVar13);
    goto LAB_0013d659;
  case 0x71:
    goto switchD_0013d4b8_caseD_71;
  case 0x73:
    o = L->base + (uVar23 - 1);
    if (*(int *)((long)L->base + uVar23 * 8 + -4) == -5) {
      pGVar21 = (GCstr *)(ulong)(o->u32).lo;
      goto LAB_0013d5f2;
    }
    pcVar20 = lj_meta_lookup(L,o,MM_tostring);
    if ((pcVar20->field_2).it != 0xffffffff) {
      pcVar8 = L->top;
      L->top = pcVar8 + 1;
      *pcVar8 = *pcVar20;
      pcVar20 = L->top;
      L->top = pcVar20 + 1;
      pcVar20->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
      lua_call(L,1,1);
      pTVar9 = L->top;
      pTVar7 = pTVar9 + -1;
      L->top = pTVar7;
      if (*(int *)((long)pTVar9 + -4) == -5) {
        pGVar21 = (GCstr *)(ulong)(pTVar7->u32).lo;
        goto LAB_0013d5f2;
      }
      o = L->base + (uVar23 - 1);
      o->u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pTVar7;
    }
    uVar4 = (o->field_2).it;
    if (uVar4 < 0xffff0000) {
      pGVar21 = lj_str_fromnum(L,&o->n);
      goto LAB_0013d5f2;
    }
    switch(uVar4 & 0xffff) {
    case 0xfff7:
      if (*(byte *)((ulong)(o->u32).lo + 6) < 2) {
LAB_0013da43:
        uVar23 = (ulong)~uVar4;
        goto LAB_0013da48;
      }
      lj_str_pushf(L,"function: builtin#%d");
      goto LAB_0013da7b;
    default:
      uVar23 = 3;
      if ((uVar4 & 0xffff8000) != 0xffff0000) goto LAB_0013da43;
LAB_0013da48:
      pcVar17 = lj_obj_itypename[uVar23];
      pvVar13 = lua_topointer(L,uVar11);
      lj_str_pushf(L,"%s: %p",pcVar17,pvVar13);
LAB_0013da7b:
      pTVar7 = L->top;
      L->top = pTVar7 + -1;
      pGVar21 = (GCstr *)(ulong)pTVar7[-1].u32.lo;
      goto LAB_0013d5f2;
    case 0xfffd:
      pcVar17 = "true";
      sStack_22c0 = 4;
      break;
    case 0xfffe:
      pcVar17 = "false";
      sStack_22c0 = 5;
      break;
    case 0xffff:
      pcVar17 = "nil";
      sStack_22c0 = 3;
    }
    pGVar21 = lj_str_new(L,pcVar17,sStack_22c0);
LAB_0013d5f2:
    pcVar17 = strchr(form,0x2e);
    if ((pcVar17 == (char *)0x0) && (99 < pGVar21->len)) {
      pTVar7 = L->top;
      L->top = pTVar7 + 1;
      (pTVar7->u32).lo = (uint32_t)pGVar21;
      (pTVar7->field_2).it = 0xfffffffb;
LAB_0013d659:
      luaL_addvalue(&b);
      goto LAB_0013d31b;
    }
    pGVar21 = pGVar21 + 1;
  }
  sprintf(buff,form,pGVar21);
LAB_0013d5b4:
  l = strlen(buff);
  luaL_addlstring(&b,buff,l);
  goto LAB_0013d31b;
switchD_0013d4b8_caseD_71:
  pGVar21 = lj_lib_checkstr(L,uVar11);
  MVar3 = pGVar21->len;
  if (&stack0xffffffffffffffd0 <= b.p) {
    luaL_prepbuffer(&b);
  }
  *b.p = 0x22;
  for (lVar15 = 0; b.p = (char *)((byte *)b.p + 1), MVar3 != (MSize)lVar15; lVar15 = lVar15 + 1) {
    bVar22 = *(byte *)((long)&pGVar21[1].nextgc.gcptr32 + lVar15);
    uVar11 = (uint)bVar22;
    if (((bVar22 == 10) || (bVar22 == 0x5c)) || (bVar22 == 0x22)) {
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
      }
      *b.p = '\\';
      b.p = b.p + 1;
    }
    else if ((""[(ulong)bVar22 + 1] & 1) != 0) {
      pcVar17 = b.p;
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
        pcVar17 = b.p;
      }
      b.p = pcVar17 + 1;
      *pcVar17 = '\\';
      if ((bVar22 < 100) &&
         ((""[(ulong)*(byte *)((long)&pGVar21[1].nextgc.gcptr32 + lVar15 + 1) + 1] & 8) == 0)) {
        if (9 < bVar22) goto LAB_0013d7ea;
      }
      else {
        if (&stack0xffffffffffffffd0 <= b.p) {
          luaL_prepbuffer(&b);
        }
        uVar11 = bVar22 - 100;
        if (99 >= bVar22) {
          uVar11 = (uint)bVar22;
        }
        *b.p = 99 < bVar22 | 0x30;
        b.p = (char *)((byte *)b.p + 1);
LAB_0013d7ea:
        if (&stack0xffffffffffffffd0 <= b.p) {
          luaL_prepbuffer(&b);
        }
        cVar10 = (char)(uVar11 * 0xcd >> 0xb);
        bVar22 = cVar10 * -10 + (char)uVar11;
        *b.p = cVar10 + '0';
        b.p = b.p + 1;
      }
      bVar22 = bVar22 + 0x30;
    }
    if (&stack0xffffffffffffffd0 <= b.p) {
      luaL_prepbuffer(&b);
    }
    *b.p = bVar22;
  }
  if (&stack0xffffffffffffffd0 <= b.p) {
    luaL_prepbuffer(&b);
  }
  *b.p = '\"';
  b.p = b.p + 1;
  goto LAB_0013d31b;
}

Assistant:

LJLIB_CF(string_format)
{
  int arg = 1, top = (int)(L->top - L->base);
  GCstr *fmt = lj_lib_checkstr(L, arg);
  const char *strfrmt = strdata(fmt);
  const char *strfrmt_end = strfrmt + fmt->len;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC) {
      luaL_addchar(&b, *strfrmt++);
    } else if (*++strfrmt == L_ESC) {
      luaL_addchar(&b, *strfrmt++);  /* %% */
    } else { /* format item */
      char form[MAX_FMTSPEC];  /* to store the format (`%...') */
      char buff[MAX_FMTITEM];  /* to store the formatted item */
      if (++arg > top)
	luaL_argerror(L, arg, lj_obj_typename[0]);
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
      case 'c':
	sprintf(buff, form, lj_lib_checkint(L, arg));
	break;
      case 'd':  case 'i':
	addintlen(form);
	sprintf(buff, form, num2intfrm(L, arg));
	break;
      case 'o':  case 'u':  case 'x':  case 'X':
	addintlen(form);
	sprintf(buff, form, num2uintfrm(L, arg));
	break;
      case 'e':  case 'E': case 'f': case 'g': case 'G': case 'a': case 'A': {
	TValue tv;
	tv.n = lj_lib_checknum(L, arg);
	if (LJ_UNLIKELY((tv.u32.hi << 1) >= 0xffe00000)) {
	  /* Canonicalize output of non-finite values. */
	  char *p, nbuf[LJ_STR_NUMBUF];
	  size_t len = lj_str_bufnum(nbuf, &tv);
	  if (strfrmt[-1] < 'a') {
	    nbuf[len-3] = nbuf[len-3] - 0x20;
	    nbuf[len-2] = nbuf[len-2] - 0x20;
	    nbuf[len-1] = nbuf[len-1] - 0x20;
	  }
	  nbuf[len] = '\0';
	  for (p = form; *p < 'A' && *p != '.'; p++) ;
	  *p++ = 's'; *p = '\0';
	  sprintf(buff, form, nbuf);
	  break;
	}
	sprintf(buff, form, (double)tv.n);
	break;
	}
      case 'q':
	addquoted(L, &b, arg);
	continue;
      case 'p':
	lj_str_pushf(L, "%p", lua_topointer(L, arg));
	luaL_addvalue(&b);
	continue;
      case 's': {
	GCstr *str = meta_tostring(L, arg);
	if (!strchr(form, '.') && str->len >= 100) {
	  /* no precision and string is too long to be formatted;
	     keep original string */
	  setstrV(L, L->top++, str);
	  luaL_addvalue(&b);
	  continue;
	}
	sprintf(buff, form, strdata(str));
	break;
	}
      default:
	lj_err_callerv(L, LJ_ERR_STRFMTO, *(strfrmt -1));
	break;
      }
      luaL_addlstring(&b, buff, strlen(buff));
    }
  }
  luaL_pushresult(&b);
  return 1;
}